

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O0

void Min_CoverWriteFile(Min_Cube_t *pCover,char *pName,int fEsop)

{
  uint uVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  char *pcVar4;
  uint local_444;
  int local_41c;
  int i;
  FILE *pFile;
  Min_Cube_t *pCube;
  char Buffer [1000];
  int fEsop_local;
  char *pName_local;
  Min_Cube_t *pCover_local;
  
  pcVar4 = "pla";
  if (fEsop != 0) {
    pcVar4 = "esop";
  }
  Buffer._996_4_ = fEsop;
  sprintf((char *)&pCube,"%s.%s",pName,pcVar4);
  sVar2 = strlen((char *)&pCube);
  local_41c = (int)sVar2;
  while (local_41c = local_41c + -1, -1 < local_41c) {
    if ((Buffer[(long)local_41c + -8] == '<') || (Buffer[(long)local_41c + -8] == '>')) {
      Buffer[(long)local_41c + -8] = '_';
    }
  }
  __stream = fopen((char *)&pCube,"w");
  pcVar4 = "SOP";
  if (Buffer._996_4_ != 0) {
    pcVar4 = "ESOP";
  }
  pcVar3 = Extra_TimeStamp();
  fprintf(__stream,"# %s cover for output %s generated by ABC on %s\n",pcVar4,pName,pcVar3);
  if (pCover == (Min_Cube_t *)0x0) {
    local_444 = 0;
  }
  else {
    local_444 = *(uint *)&pCover->field_0x8 & 0x3ff;
  }
  fprintf(__stream,".i %d\n",(ulong)local_444);
  fprintf(__stream,".o %d\n",1);
  uVar1 = Min_CoverCountCubes(pCover);
  fprintf(__stream,".p %d\n",(ulong)uVar1);
  pFile = (FILE *)pCover;
  if (Buffer._996_4_ != 0) {
    fprintf(__stream,".type esop\n");
  }
  for (; pFile != (FILE *)0x0; pFile = *(FILE **)pFile) {
    Min_CubeWrite((FILE *)__stream,(Min_Cube_t *)pFile);
  }
  fprintf(__stream,".e\n");
  fclose(__stream);
  return;
}

Assistant:

void Min_CoverWriteFile( Min_Cube_t * pCover, char * pName, int fEsop )
{
    char Buffer[1000];
    Min_Cube_t * pCube;
    FILE * pFile;
    int i;
    sprintf( Buffer, "%s.%s", pName, fEsop? "esop" : "pla" );
    for ( i = strlen(Buffer) - 1; i >= 0; i-- )
        if ( Buffer[i] == '<' || Buffer[i] == '>' )
            Buffer[i] = '_';
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# %s cover for output %s generated by ABC on %s\n", fEsop? "ESOP":"SOP", pName, Extra_TimeStamp() );
    fprintf( pFile, ".i %d\n", pCover? pCover->nVars : 0 );
    fprintf( pFile, ".o %d\n", 1 );
    fprintf( pFile, ".p %d\n", Min_CoverCountCubes(pCover) );
    if ( fEsop ) fprintf( pFile, ".type esop\n" );
    Min_CoverForEachCube( pCover, pCube )
        Min_CubeWrite( pFile, pCube );
    fprintf( pFile, ".e\n" );
    fclose( pFile );
}